

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.h
# Opt level: O0

string * __thiscall beagle::plugin::Plugin::pluginType_abi_cxx11_(Plugin *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 0x58));
  return in_RDI;
}

Assistant:

virtual std::string pluginType() const{ return m_plugin_type; }